

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode o3dgc::SaveBinData(Vector<long> *data,BinaryStream *bstream)

{
  unsigned_long position;
  unsigned_long uVar1;
  long *plVar2;
  ulong local_40;
  unsigned_long h;
  unsigned_long i;
  long symbol;
  unsigned_long size;
  unsigned_long start;
  BinaryStream *bstream_local;
  Vector<long> *data_local;
  
  position = BinaryStream::GetSize(bstream);
  BinaryStream::WriteUInt32ASCII(bstream,0);
  uVar1 = Vector<long>::GetSize(data);
  BinaryStream::WriteUInt32ASCII(bstream,uVar1);
  h = 0;
  while (h < uVar1) {
    i = 0;
    for (local_40 = 0; local_40 < 7 && h < uVar1; local_40 = local_40 + 1) {
      plVar2 = Vector<long>::operator[](data,h);
      i = (*plVar2 << ((byte)local_40 & 0x3f)) + i;
      h = h + 1;
    }
    BinaryStream::WriteUCharASCII(bstream,(uchar)i);
  }
  uVar1 = BinaryStream::GetSize(bstream);
  BinaryStream::WriteUInt32ASCII(bstream,position,uVar1 - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    SaveBinData(const Vector<long> & data,
                                  BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        bstream.WriteUInt32ASCII(0);
        const unsigned long size = data.GetSize();
        long symbol;
        bstream.WriteUInt32ASCII(size);
        for(unsigned long i = 0; i < size; )
        {
            symbol = 0;
            for(unsigned long h = 0; h < O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0 && i < size; ++h)
            {
                symbol += (data[i] << h);
                ++i;
            }
            bstream.WriteUCharASCII((unsigned char) symbol);
        }
        bstream.WriteUInt32ASCII(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }